

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MultiplePursuit.cpp
# Opt level: O0

void __thiscall anon_unknown.dwarf_51d71::MpPlugIn::reset(MpPlugIn *this)

{
  bool bVar1;
  MpPursuer *in_RDI;
  iterator i;
  LocalSpaceMixin<OpenSteer::AbstractLocalSpace> *in_stack_00000090;
  __normal_iterator<(anonymous_namespace)::MpBase_*const_*,_std::vector<(anonymous_namespace)::MpBase_*,_std::allocator<(anonymous_namespace)::MpBase_*>_>_>
  *in_stack_ffffffffffffffd8;
  __normal_iterator<(anonymous_namespace)::MpBase_*const_*,_std::vector<(anonymous_namespace)::MpBase_*,_std::allocator<(anonymous_namespace)::MpBase_*>_>_>
  in_stack_ffffffffffffffe8;
  __normal_iterator<(anonymous_namespace)::MpBase_*const_*,_std::vector<(anonymous_namespace)::MpBase_*,_std::allocator<(anonymous_namespace)::MpBase_*>_>_>
  local_10 [2];
  
  MpWanderer::reset((MpWanderer *)in_RDI);
  local_10[0]._M_current =
       *(MpBase ***)
        &(in_RDI->super_MpBase).super_SimpleVehicle.super_SimpleVehicle_3.
         super_AnnotationMixin<OpenSteer::LocalSpaceMixin<OpenSteer::AbstractVehicle>_>.
         super_LocalSpaceMixin<OpenSteer::AbstractVehicle>._forward;
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<(anonymous_namespace)::MpBase_*const_*,_std::vector<(anonymous_namespace)::MpBase_*,_std::allocator<(anonymous_namespace)::MpBase_*>_>_>
                        *)in_RDI,in_stack_ffffffffffffffd8);
    if (!bVar1) break;
    __gnu_cxx::
    __normal_iterator<(anonymous_namespace)::MpBase_*const_*,_std::vector<(anonymous_namespace)::MpBase_*,_std::allocator<(anonymous_namespace)::MpBase_*>_>_>
    ::operator*(local_10);
    MpPursuer::reset(in_RDI);
    in_stack_ffffffffffffffe8 =
         __gnu_cxx::
         __normal_iterator<(anonymous_namespace)::MpBase_*const_*,_std::vector<(anonymous_namespace)::MpBase_*,_std::allocator<(anonymous_namespace)::MpBase_*>_>_>
         ::operator++(in_stack_ffffffffffffffe8._M_current,(int)((ulong)in_RDI >> 0x20));
  }
  OpenSteer::Camera::doNotSmoothNextMove(&OpenSteer::OpenSteerDemo::camera);
  OpenSteer::LocalSpaceMixin<OpenSteer::AbstractLocalSpace>::resetLocalSpace(in_stack_00000090);
  return;
}

Assistant:

void reset (void)
        {
            // reset wanderer and pursuers
            wanderer->reset ();
            for (iterator i = pBegin; i != pEnd; i++) ((MpPursuer&)(**i)).reset ();

            // immediately jump to default camera position
            OpenSteerDemo::camera.doNotSmoothNextMove ();
            OpenSteerDemo::camera.resetLocalSpace ();
        }